

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t charmap_ConvertNext(char **input,uint8_t **output)

{
  char cVar1;
  uint8_t uVar2;
  Charmap *pCVar3;
  uint8_t *puVar4;
  int iVar5;
  char *pcVar6;
  uint8_t *local_58;
  size_t codepointLen;
  int firstChar;
  uint8_t c;
  size_t rewindDistance;
  Charnode *match;
  Charnode *node;
  Charmap *charmap;
  uint8_t **output_local;
  char **input_local;
  
  pCVar3 = *currentCharmap;
  match = (Charnode *)(pCVar3 + 1);
  rewindDistance = 0;
  _firstChar = 0;
  while ((cVar1 = **input, **input != '\0' && (match->next[(byte)(cVar1 - 1U)] != 0))) {
    *input = *input + 1;
    _firstChar = _firstChar + 1;
    match = (Charnode *)((long)pCVar3 + match->next[(byte)(cVar1 - 1U)] * 0x800 + 0x18);
    if ((match->isTerminal & 1U) != 0) {
      _firstChar = 0;
      rewindDistance = (size_t)match;
    }
  }
  *input = *input + -_firstChar;
  if (rewindDistance == 0) {
    if (**input == '\0') {
      input_local = (char **)0x0;
    }
    else {
      cVar1 = **input;
      if (output == (uint8_t **)0x0) {
        local_58 = (uint8_t *)0x0;
      }
      else {
        local_58 = *output;
      }
      input_local = (char **)readUTF8Char(local_58,*input);
      if (input_local == (char **)0x0) {
        error("Input string is not valid UTF-8\n");
      }
      *input = (char *)((long)input_local + (long)*input);
      if (output != (uint8_t **)0x0) {
        *output = (uint8_t *)((long)input_local + (long)*output);
      }
      if (pCVar3->usedNodes < 2) {
        iVar5 = strcmp(pCVar3->name,"main");
        if (iVar5 != 0) {
          pcVar6 = printChar((int)cVar1);
          warning(WARNING_UNMAPPED_CHAR_2,"Unmapped character %s not in main charmap\n",pcVar6);
        }
      }
      else {
        pcVar6 = printChar((int)cVar1);
        warning(WARNING_UNMAPPED_CHAR_1,"Unmapped character %s\n",pcVar6);
      }
    }
  }
  else {
    if (output != (uint8_t **)0x0) {
      uVar2 = *(uint8_t *)(rewindDistance + 1);
      puVar4 = *output;
      *output = puVar4 + 1;
      *puVar4 = uVar2;
    }
    input_local = (char **)0x1;
  }
  return (size_t)input_local;
}

Assistant:

size_t charmap_ConvertNext(char const **input, uint8_t **output)
{
	// The goal is to match the longest mapping possible.
	// For that, advance through the trie with each character read.
	// If that would lead to a dead end, rewind characters until the last match, and output.
	// If no match, read a UTF-8 codepoint and output that.
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];
	struct Charnode const *match = NULL;
	size_t rewindDistance = 0;

	for (;;) {
		uint8_t c = **input - 1;

		if (**input && node->next[c]) {
			// Consume that char
			(*input)++;
			rewindDistance++;

			// Advance to next node (index starts at 1)
			node = &charmap->nodes[node->next[c]];
			if (node->isTerminal) {
				// This node matches, register it
				match = node;
				rewindDistance = 0; // If no longer match is found, rewind here
			}

		} else {
			// We are at a dead end (either because we reached the end of input, or of
			// the trie), so rewind up to the last match, and output.
			*input -= rewindDistance; // This will rewind all the way if no match found

			if (match) { // A match was found, use it
				if (output)
					*(*output)++ = match->value;

				return 1;

			} else if (**input) { // No match found, but there is some input left
				int firstChar = **input;
				// This will write the codepoint's value to `output`, little-endian
				size_t codepointLen = readUTF8Char(output ? *output : NULL,
								   *input);

				if (codepointLen == 0)
					error("Input string is not valid UTF-8\n");

				// OK because UTF-8 has no NUL in multi-byte chars
				*input += codepointLen;
				if (output)
					*output += codepointLen;

				// Warn if this character is not mapped but any others are
				if (charmap->usedNodes > 1)
					warning(WARNING_UNMAPPED_CHAR_1,
						"Unmapped character %s\n", printChar(firstChar));
				else if (strcmp(charmap->name, DEFAULT_CHARMAP_NAME))
					warning(WARNING_UNMAPPED_CHAR_2,
						"Unmapped character %s not in " DEFAULT_CHARMAP_NAME
						" charmap\n", printChar(firstChar));

				return codepointLen;

			} else { // End of input
				return 0;
			}
		}
	}
}